

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

int getfield(lua_State *L,char *key,int d,int delta)

{
  int iVar1;
  lua_Integer lVar2;
  int local_38;
  lua_Integer res;
  int t;
  int isnum;
  int delta_local;
  int d_local;
  char *key_local;
  lua_State *L_local;
  
  t = delta;
  isnum = d;
  _delta_local = key;
  key_local = (char *)L;
  res._0_4_ = lua_getfield(L,-1,key);
  lVar2 = lua_tointegerx((lua_State *)key_local,-1,(int *)((long)&res + 4));
  if (res._4_4_ == 0) {
    if ((int)res != 0) {
      iVar1 = luaL_error((lua_State *)key_local,"field \'%s\' is not an integer",_delta_local);
      return iVar1;
    }
    if (isnum < 0) {
      iVar1 = luaL_error((lua_State *)key_local,"field \'%s\' missing in date table",_delta_local);
      return iVar1;
    }
    local_38 = isnum;
LAB_0011d814:
    lua_settop((lua_State *)key_local,-2);
    L_local._4_4_ = local_38;
  }
  else {
    if (lVar2 < 0) {
      if (t + -0x80000000 <= lVar2) goto LAB_0011d805;
    }
    else if (lVar2 - t < 0x80000000) {
LAB_0011d805:
      local_38 = (int)lVar2 - t;
      goto LAB_0011d814;
    }
    L_local._4_4_ = luaL_error((lua_State *)key_local,"field \'%s\' is out-of-bound",_delta_local);
  }
  return L_local._4_4_;
}

Assistant:

static int getfield (lua_State *L, const char *key, int d, int delta) {
  int isnum;
  int t = lua_getfield(L, -1, key);  /* get field and its type */
  lua_Integer res = lua_tointegerx(L, -1, &isnum);
  if (!isnum) {  /* field is not an integer? */
    if (l_unlikely(t != LUA_TNIL))  /* some other value? */
      return luaL_error(L, "field '%s' is not an integer", key);
    else if (l_unlikely(d < 0))  /* absent field; no default? */
      return luaL_error(L, "field '%s' missing in date table", key);
    res = d;
  }
  else {
    if (!(res >= 0 ? res - delta <= INT_MAX : INT_MIN + delta <= res))
      return luaL_error(L, "field '%s' is out-of-bound", key);
    res -= delta;
  }
  lua_pop(L, 1);
  return (int)res;
}